

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

olsrv2_tc_attachment * olsrv2_tc_endpoint_add(olsrv2_tc_node *node,os_route_key *prefix,_Bool mesh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  avl_node *paVar4;
  olsrv2_tc_attachment *ptr;
  olsrv2_tc_endpoint *ptr_00;
  long lVar5;
  
  paVar4 = avl_find(&node->_attached_networks,prefix);
  if (paVar4 != (avl_node *)0x0) {
    return (olsrv2_tc_attachment *)&paVar4[-1].parent;
  }
  ptr = (olsrv2_tc_attachment *)oonf_class_malloc(&_tc_attached_class);
  if (ptr == (olsrv2_tc_attachment *)0x0) {
LAB_00135965:
    ptr = (olsrv2_tc_attachment *)0x0;
  }
  else {
    paVar4 = avl_find(&_tc_endpoint_tree,prefix);
    ptr_00 = (olsrv2_tc_endpoint *)&paVar4[-4].balance;
    if (paVar4 == (avl_node *)0x0) {
      ptr_00 = (olsrv2_tc_endpoint *)oonf_class_malloc(&_tc_endpoint_class);
      if (ptr_00 == (olsrv2_tc_endpoint *)0x0) {
        oonf_class_free(&_tc_attached_class,ptr);
        goto LAB_00135965;
      }
      (ptr_00->target).type = OLSRV2_NETWORK_TARGET - mesh;
      avl_init(&ptr_00->_attached_networks,os_routing_avl_cmp_route_key,false);
      *(undefined4 *)((ptr_00->target).prefix.src._addr + 0xe) =
           *(undefined4 *)((prefix->src)._addr + 0xe);
      uVar1 = *(undefined8 *)(prefix->dst)._addr;
      uVar2 = *(undefined8 *)((prefix->dst)._addr + 8);
      uVar3 = *(undefined8 *)((prefix->src)._addr + 6);
      *(undefined8 *)&(ptr_00->target).prefix.dst._type = *(undefined8 *)&(prefix->dst)._type;
      *(undefined8 *)((ptr_00->target).prefix.src._addr + 6) = uVar3;
      *(undefined8 *)(ptr_00->target).prefix.dst._addr = uVar1;
      *(undefined8 *)((ptr_00->target).prefix.dst._addr + 8) = uVar2;
      (ptr_00->_node).key = ptr_00;
      avl_insert(&_tc_endpoint_tree,&ptr_00->_node);
      oonf_class_event(&_tc_endpoint_class,ptr_00,OONF_OBJECT_ADDED);
    }
    ptr->src = node;
    ptr->dst = ptr_00;
    lVar5 = 4;
    do {
      ptr->cost[lVar5 + 0xfffffffffffffffc] = 0xffffff;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    (ptr->_src_node).key = ptr_00;
    avl_insert(&node->_attached_networks,&ptr->_src_node);
    (ptr->_endpoint_node).key = node;
    avl_insert(&ptr_00->_attached_networks,&ptr->_endpoint_node);
    olsrv2_routing_dijkstra_node_init(&(ptr_00->target)._dijkstra,(netaddr *)node);
    oonf_class_event(&_tc_attached_class,ptr,OONF_OBJECT_ADDED);
  }
  return ptr;
}

Assistant:

struct olsrv2_tc_attachment *
olsrv2_tc_endpoint_add(struct olsrv2_tc_node *node, struct os_route_key *prefix, bool mesh) {
  struct olsrv2_tc_attachment *net;
  struct olsrv2_tc_endpoint *end;
  int i;

  net = avl_find_element(&node->_attached_networks, prefix, net, _src_node);
  if (net != NULL) {
    return net;
  }

  net = oonf_class_malloc(&_tc_attached_class);
  if (net == NULL) {
    return NULL;
  }

  end = avl_find_element(&_tc_endpoint_tree, prefix, end, _node);
  if (end == NULL) {
    /* create new endpoint */
    end = oonf_class_malloc(&_tc_endpoint_class);
    if (end == NULL) {
      oonf_class_free(&_tc_attached_class, net);
      return NULL;
    }

    /* initialize endpoint */
    end->target.type = mesh ? OLSRV2_ADDRESS_TARGET : OLSRV2_NETWORK_TARGET;
    avl_init(&end->_attached_networks, os_routing_avl_cmp_route_key, false);

    /* attach to global tree */
    memcpy(&end->target.prefix, prefix, sizeof(*prefix));
    end->_node.key = &end->target.prefix;
    avl_insert(&_tc_endpoint_tree, &end->_node);

    oonf_class_event(&_tc_endpoint_class, end, OONF_OBJECT_ADDED);
  }

  /* initialize attached network */
  net->src = node;
  net->dst = end;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    net->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook into src node */
  net->_src_node.key = &end->target.prefix;
  avl_insert(&node->_attached_networks, &net->_src_node);

  /* hook into endpoint */
  net->_endpoint_node.key = &node->target.prefix;
  avl_insert(&end->_attached_networks, &net->_endpoint_node);

  /* initialize dijkstra data */
  olsrv2_routing_dijkstra_node_init(&end->target._dijkstra, &node->target.prefix.dst);

  oonf_class_event(&_tc_attached_class, net, OONF_OBJECT_ADDED);
  return net;
}